

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_http.c
# Opt level: O1

int nghttp2_http_on_remote_end_stream(nghttp2_stream *stream)

{
  int iVar1;
  
  iVar1 = -1;
  if (((stream->http_flags & 0x4000) == 0) &&
     ((stream->content_length == -1 || (stream->content_length == stream->recv_content_length)))) {
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int nghttp2_http_on_remote_end_stream(nghttp2_stream *stream) {
  if (stream->http_flags & NGHTTP2_HTTP_FLAG_EXPECT_FINAL_RESPONSE) {
    return -1;
  }

  if (stream->content_length != -1 &&
      stream->content_length != stream->recv_content_length) {
    return -1;
  }

  return 0;
}